

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O0

btree_result btree_iterator_init(btree *btree,btree_iterator *it,void *initial_key)

{
  void *pvVar1;
  long in_RDX;
  void *in_RSI;
  byte *in_RDI;
  int i;
  int local_1c;
  
  memcpy(in_RSI,in_RDI,0x38);
  pvVar1 = malloc((ulong)*in_RDI);
  *(void **)((long)in_RSI + 0x38) = pvVar1;
  if (*(long *)(*(long *)(in_RDI + 0x20) + 0x30) != 0) {
    (**(code **)(*(long *)(in_RDI + 0x20) + 0x30))(in_RDI,*(undefined8 *)((long)in_RSI + 0x38),0);
  }
  if (in_RDX != 0) {
    (**(code **)(*(long *)(in_RDI + 0x20) + 0x40))
              (in_RDI,*(undefined8 *)((long)in_RSI + 0x38),in_RDX);
  }
  pvVar1 = malloc((ulong)*(ushort *)(in_RDI + 2) << 3);
  *(void **)((long)in_RSI + 0x40) = pvVar1;
  pvVar1 = malloc((ulong)*(ushort *)(in_RDI + 2) << 1);
  *(void **)((long)in_RSI + 0x48) = pvVar1;
  pvVar1 = malloc((ulong)*(ushort *)(in_RDI + 2) << 3);
  *(void **)((long)in_RSI + 0x50) = pvVar1;
  pvVar1 = malloc((ulong)*(ushort *)(in_RDI + 2) << 3);
  *(void **)((long)in_RSI + 0x58) = pvVar1;
  for (local_1c = 0; local_1c < (int)(uint)*(ushort *)(in_RDI + 2); local_1c = local_1c + 1) {
    *(undefined8 *)(*(long *)((long)in_RSI + 0x40) + (long)local_1c * 8) = 0xffffffffffffffff;
    *(undefined2 *)(*(long *)((long)in_RSI + 0x48) + (long)local_1c * 2) = 0xffff;
    *(undefined8 *)(*(long *)((long)in_RSI + 0x50) + (long)local_1c * 8) = 0;
    *(undefined8 *)(*(long *)((long)in_RSI + 0x58) + (long)local_1c * 8) = 0;
  }
  *(undefined8 *)(*(long *)((long)in_RSI + 0x40) + (long)(int)(*(ushort *)(in_RDI + 2) - 1) * 8) =
       *(undefined8 *)(in_RDI + 8);
  *(undefined1 *)((long)in_RSI + 0x60) = 0;
  return BTREE_RESULT_SUCCESS;
}

Assistant:

btree_result btree_iterator_init(struct btree *btree,
                                 struct btree_iterator *it, void *initial_key)
{
    int i;

    it->btree = *btree;
    it->curkey = (void *)mempool_alloc(btree->ksize);
    if (btree->kv_ops->init_kv_var) {
        btree->kv_ops->init_kv_var(btree, it->curkey, NULL);
    }
    if (initial_key) {
        // set initial key if exists
        //memcpy(it->curkey, initial_key, btree->ksize);
        btree->kv_ops->set_key(btree, it->curkey, initial_key);
    }else{
        // NULL initial key .. set minimum key (start from leftmost key)
        // replaced by kv_ops->init_kv_var
        //memset(it->curkey, 0, btree->ksize);
    }
    it->bid = (bid_t*)mempool_alloc(sizeof(bid_t) * btree->height);
    it->idx = (idx_t*)mempool_alloc(sizeof(idx_t) * btree->height);
    it->node = (struct bnode **)mempool_alloc(sizeof(struct bnode *)
                                                              * btree->height);
    it->addr = (void**)mempool_alloc(sizeof(void*) * btree->height);

    for (i=0;i<btree->height;++i){
        it->bid[i] = BTREE_BLK_NOT_FOUND;
        it->idx[i] = BTREE_IDX_NOT_FOUND;
        it->node[i] = NULL;
        it->addr[i] = NULL;
    }
    it->bid[btree->height-1] = btree->root_bid;
    it->flags = 0;

    return BTREE_RESULT_SUCCESS;
}